

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void rope_yarn(float theta_extrap,float freq_scale,float *corr_dims,int64_t i0,float ext_factor,
              float mscale,float *cos_theta,float *sin_theta)

{
  undefined1 auVar1 [16];
  float *in_RCX;
  float *in_RDX;
  int in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  undefined1 auVar3 [64];
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float ramp_mix;
  float theta;
  float theta_interp;
  float local_38;
  float local_20;
  undefined1 extraout_var [60];
  
  local_38 = in_XMM1_Da * in_XMM0_Da;
  if ((in_XMM2_Da != 0.0) || (local_20 = in_XMM3_Da, NAN(in_XMM2_Da))) {
    fVar2 = rope_yarn_ramp(*in_RDI,in_RDI[1],in_ESI);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar2 * in_XMM2_Da)),ZEXT416((uint)local_38),
                             ZEXT416((uint)(in_XMM0_Da * fVar2 * in_XMM2_Da)));
    local_38 = auVar1._0_4_;
    auVar3._0_4_ = logf(1.0 / in_XMM1_Da);
    auVar3._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3dcccccd),0),auVar3._0_16_,
                             SUB6416(ZEXT464(0x3f800000),0));
    local_20 = auVar1._0_4_ * in_XMM3_Da;
  }
  fVar2 = cosf(local_38);
  *in_RDX = fVar2 * local_20;
  fVar2 = sinf(local_38);
  *in_RCX = fVar2 * local_20;
  return;
}

Assistant:

static void rope_yarn(
    float theta_extrap, float freq_scale, float corr_dims[2], int64_t i0, float ext_factor, float mscale,
    float * cos_theta, float * sin_theta) {
    // Get n-d rotational scaling corrected for extrapolation
    float theta_interp = freq_scale * theta_extrap;
    float theta = theta_interp;
    if (ext_factor != 0.0f) {
        float ramp_mix = rope_yarn_ramp(corr_dims[0], corr_dims[1], i0) * ext_factor;
        theta = theta_interp * (1 - ramp_mix) + theta_extrap * ramp_mix;

        // Get n-d magnitude scaling corrected for interpolation
        mscale *= 1.0f + 0.1f * logf(1.0f / freq_scale);
    }
    *cos_theta = cosf(theta) * mscale;
    *sin_theta = sinf(theta) * mscale;
}